

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int8_t *piVar5;
  undefined7 in_register_00000009;
  int extraout_EDX;
  int extraout_EDX_00;
  int bit;
  int bit_00;
  __m128i *out;
  __m128i *out_00;
  __m128i buf0 [16];
  __m128i buf1 [16];
  __m256i buf2 [8];
  longlong local_360 [16];
  longlong local_2e0 [16];
  longlong local_260 [16];
  longlong alStack_1e0 [16];
  longlong local_160;
  longlong lStack_158;
  longlong local_150;
  longlong lStack_148;
  longlong local_140;
  longlong lStack_138;
  longlong local_130;
  longlong lStack_128;
  longlong local_120;
  longlong lStack_118;
  longlong local_110;
  longlong lStack_108;
  longlong local_100;
  longlong lStack_f8;
  longlong local_f0;
  longlong lStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong local_d0;
  longlong lStack_c8;
  longlong local_c0;
  longlong lStack_b8;
  longlong local_b0;
  longlong lStack_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong local_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong local_70;
  longlong lStack_68;
  
  piVar5 = av1_fwd_txfm_shift_ls[7];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm8x16_arr + (ulong)(uVar3 * 8));
  pcVar2 = *(code **)((long)row_txfm8x16_arr + (ulong)(uVar3 * 8));
  bVar4 = false;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_009f4b0e:
      load_buffer_16bit_to_16bit_flip(input,stride,(__m128i *)local_360,0x10);
      bit = extraout_EDX_00;
      goto LAB_009f4b20;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        bVar4 = true;
        goto LAB_009f4b0e;
      }
    }
    else {
      bVar4 = true;
    }
  }
  load_buffer_16bit_to_16bit(input,stride,(__m128i *)local_360,0x10);
  bit = extraout_EDX;
LAB_009f4b20:
  round_shift_16bit((__m128i *)local_360,(int)*piVar5,bit);
  (*pcVar1)((__m128i *)local_360,(__m128i *)local_360,0xd);
  round_shift_16bit((__m128i *)local_360,(int)piVar5[1],bit_00);
  out = (__m128i *)local_260;
  transpose_16bit_8x8((__m128i *)local_360,out);
  out_00 = (__m128i *)alStack_1e0;
  transpose_16bit_8x8((__m128i *)local_2e0,out_00);
  if (bVar4) {
    flip_buf_sse2((__m128i *)local_260,(__m128i *)local_360,8);
    flip_buf_sse2(out_00,(__m128i *)local_2e0,8);
    out = (__m128i *)local_360;
    out_00 = (__m128i *)local_2e0;
  }
  local_160 = (*out)[0];
  lStack_158 = (*out)[1];
  local_150 = out[8][0];
  lStack_148 = out[8][1];
  local_140 = out[1][0];
  lStack_138 = out[1][1];
  local_130 = out_00[1][0];
  lStack_128 = out_00[1][1];
  local_120 = out[2][0];
  lStack_118 = out[2][1];
  local_110 = out_00[2][0];
  lStack_108 = out_00[2][1];
  local_100 = out[3][0];
  lStack_f8 = out[3][1];
  local_f0 = out_00[3][0];
  lStack_e8 = out_00[3][1];
  local_e0 = out[4][0];
  lStack_d8 = out[4][1];
  local_d0 = out_00[4][0];
  lStack_c8 = out_00[4][1];
  local_c0 = out[5][0];
  lStack_b8 = out[5][1];
  local_b0 = out_00[5][0];
  lStack_a8 = out_00[5][1];
  local_a0 = out[6][0];
  lStack_98 = out[6][1];
  local_90 = out_00[6][0];
  lStack_88 = out_00[6][1];
  local_80 = out[7][0];
  lStack_78 = out[7][1];
  local_70 = out_00[7][0];
  lStack_68 = out_00[7][1];
  (*pcVar2)((__m256i *)&local_160,(__m256i *)&local_160,0xd);
  round_shift_16bit_w16_avx2((__m256i *)&local_160,8,(int)piVar5[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2((__m256i *)&local_160,output,0x10,8);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  __m128i *bufl, *bufu;
  if (lr_flip) {
    bufl = buf0;
    bufu = buf0 + 8;
    flip_buf_sse2(buf1 + width * 0, bufl, width);
    flip_buf_sse2(buf1 + width * 1, bufu, width);
  } else {
    bufl = buf1 + width * 0;
    bufu = buf1 + width * 1;
  }
  pack_reg(bufl, bufu, buf2);
  row_txfm(buf2, buf2, cos_bit_row);
  round_shift_16bit_w16_avx2(buf2, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf2, output, height, width);
}